

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void ImGui::SFML::SetJoystickMapping(int action,uint joystickButton)

{
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x262,"void ImGui::SFML::SetJoystickMapping(int, unsigned int)");
  }
  if (action < 0x14) {
    if (joystickButton < 0x20) {
      *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x54 + (long)action * 4) = joystickButton;
      return;
    }
    __assert_fail("joystickButton < sf::Joystick::ButtonCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x264,"void ImGui::SFML::SetJoystickMapping(int, unsigned int)");
  }
  __assert_fail("action < ImGuiNavInput_COUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                ,0x263,"void ImGui::SFML::SetJoystickMapping(int, unsigned int)");
}

Assistant:

void SetJoystickMapping(int action, unsigned int joystickButton) {
    assert(s_currWindowCtx);
    assert(action < ImGuiNavInput_COUNT);
    assert(joystickButton < sf::Joystick::ButtonCount);
    s_currWindowCtx->joystickMapping[action] = joystickButton;
}